

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void ngai_nbputs(char *loc_base_ptr,char *pbuf,int *stride_loc,char *prem,int *stride_rem,int *count
                ,int nstrides,int proc,int field_off,int field_size,int type_size,
                armci_hdl_t *nbhandle)

{
  int in_ECX;
  armci_hdl_t *in_RDX;
  int *in_RDI;
  int *in_R9;
  int in_stack_00000008;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int i;
  undefined8 in_stack_ffffffffffffffa8;
  int *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  armci_hdl_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar1;
  int iVar2;
  int *dst_stride_arr;
  armci_hdl_t *nb_handle;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if ((in_stack_00000020 < 0) || (in_stack_00000020 == in_stack_00000028)) {
    ARMCI_NbPutS(in_R9,(int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,iVar2
                 ,in_ECX,in_RDX);
  }
  else {
    dst_stride_arr = in_R9 + -1;
    nb_handle = in_RDX + -1;
    for (iVar1 = 1; iVar1 < in_stack_00000008 + 1; iVar1 = iVar1 + 1) {
      nb_handle[iVar1] = nb_handle[iVar1] / in_stack_00000028;
      nb_handle[iVar1] = in_stack_00000020 * nb_handle[iVar1];
      in_stack_ffffffffffffffc0 = nb_handle;
    }
    *in_R9 = *in_R9 / in_stack_00000028;
    ARMCI_NbPutS(dst_stride_arr,(int *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
                 in_stack_ffffffffffffffc0,dst_stride_arr,in_RDI,iVar2,in_ECX + in_stack_00000018,
                 nb_handle);
    dst_stride_arr[1] = in_stack_00000028 * dst_stride_arr[1];
    for (iVar2 = 1; iVar2 < in_stack_00000008 + 1; iVar2 = iVar2 + 1) {
      nb_handle[iVar2] = nb_handle[iVar2] / in_stack_00000020;
      nb_handle[iVar2] = in_stack_00000028 * nb_handle[iVar2];
    }
  }
  return;
}

Assistant:

static void ngai_nbputs(char *loc_base_ptr, char *pbuf,int *stride_loc, char *prem, int *stride_rem,
		      int *count, int nstrides, int proc, int field_off, 
			int field_size, int type_size, armci_hdl_t *nbhandle) {
  if(field_size<0 || field_size == type_size) {
    ARMCI_NbPutS(pbuf,stride_loc,prem,stride_rem,count,nstrides,proc,nbhandle);
  }
  else {
    int i;
    count -= 1;
    stride_loc -= 1;
    stride_rem -= 1;
    nstrides += 1;

    for(i=1; i<nstrides; i++) {
      stride_loc[i] /= type_size;
      stride_loc[i] *= field_size;
    }

    pbuf = loc_base_ptr + (pbuf - loc_base_ptr)/type_size*field_size;
    prem += field_off;

    count[1] /= type_size; 
    ARMCI_NbPutS(pbuf,stride_loc,prem,stride_rem,count,nstrides,proc, nbhandle);
    count[1] *= type_size; /*restore*/
    for(i=1; i<nstrides; i++) {
      stride_loc[i] /= field_size;
      stride_loc[i] *= type_size;
    }
  }
}